

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zel_basic_leak_checker.cpp
# Opt level: O2

ze_result_t __thiscall
validation_layer::basic_leakChecker::ZEbasic_leakChecker::zeImageDestroyEpilogue
          (ZEbasic_leakChecker *this,ze_image_handle_t param_1,ze_result_t result)

{
  allocator local_39;
  string local_38;
  
  if (result == ZE_RESULT_SUCCESS) {
    std::__cxx11::string::string((string *)&local_38,"zeImageDestroy",&local_39);
    countFunctionCall(this,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
  }
  return result;
}

Assistant:

ze_result_t basic_leakChecker::ZEbasic_leakChecker::zeImageDestroyEpilogue(ze_image_handle_t, ze_result_t result) {
        if (result == ZE_RESULT_SUCCESS) {
            countFunctionCall("zeImageDestroy");
        }
        return result;
    }